

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O3

void __thiscall FileWriter::FileWriter(FileWriter *this,string *filename)

{
  pointer pcVar1;
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + filename->_M_string_length);
  std::fstream::fstream((fstream *)&this->file,(string *)filename,_S_out|_S_bin);
  BufferWriter::BufferWriter(&this->buffer,0x80000);
  return;
}

Assistant:

FileWriter::FileWriter(const std::string &filename)
		: filename(filename),
		  file(std::fstream(filename, std::ios::out | std::ios::binary)),
		  buffer(BYTES_PER_BUFFER)
{
	
}